

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::Slider::minimumSizeHint(Slider *this)

{
  int iVar1;
  int iVar2;
  SliderPrivate *pSVar3;
  int local_28;
  int local_24;
  int h;
  int w;
  int height;
  int minWidth;
  Slider *this_local;
  
  pSVar3 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
           ::operator->(&this->d);
  local_24 = pSVar3->radius * 10 + 3;
  pSVar3 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
           ::operator->(&this->d);
  iVar1 = pSVar3->radius * 2 + 3;
  iVar2 = QAbstractSlider::orientation();
  local_28 = iVar1;
  if (iVar2 == 2) {
    local_28 = local_24;
    local_24 = iVar1;
  }
  QSize::QSize((QSize *)&this_local,local_24,local_28);
  return (QSize)this_local;
}

Assistant:

QSize
Slider::minimumSizeHint() const
{
	const int minWidth = d->radius * 10 + 3;
	const int height = d->radius * 2 + 3;

	int w = minWidth;
	int h = height;

	if( orientation() == Qt::Vertical )
	{
		w = height;
		h = minWidth;
	}

	return QSize( w, h );
}